

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_3::traverseVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,char *subPath,VarType *type)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  VarTokenizer tokenizer;
  VarTokenizer local_80;
  VarType *local_68;
  char *local_60;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *local_58;
  Data local_50;
  undefined4 local_48;
  long local_40 [2];
  
  glu::VarTokenizer::VarTokenizer(&local_80,subPath);
  local_48 = 0;
  local_50.type = type;
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  ::emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
            (typePath,(VariablePathComponent *)&local_50);
  bVar1 = true;
  if (local_80.m_token != TOKEN_END) {
    if (local_80.m_token == TOKEN_PERIOD && type->m_type == TYPE_STRUCT) {
      glu::VarTokenizer::advance(&local_80);
      if (local_80.m_token == TOKEN_IDENTIFIER) {
        uVar3 = (int)((ulong)((long)(((type->m_data).structPtr)->m_members).
                                    super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(((type->m_data).structPtr)->m_members).
                                   super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
        bVar1 = 0 < (int)uVar3;
        if (0 < (int)uVar3) {
          lVar5 = 0x20;
          lVar6 = 0;
          local_68 = type;
          local_60 = subPath;
          local_58 = typePath;
          do {
            local_50.type = (VarType *)local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,local_80.m_str + local_80.m_tokenStart,
                       local_80.m_str + local_80.m_tokenStart + local_80.m_tokenLen);
            iVar4 = std::__cxx11::string::compare((char *)&local_50);
            if (local_50.type != (VarType *)local_40) {
              operator_delete(local_50.type,local_40[0] + 1);
            }
            if (iVar4 == 0) {
              bVar2 = traverseVariablePath
                                (local_58,local_60 + (local_80.m_tokenLen + local_80.m_tokenStart),
                                 (VarType *)
                                 ((long)&(((((local_68->m_data).structPtr)->m_members).
                                           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_name).
                                         _M_dataplus._M_p + lVar5));
              uVar3 = (uint)bVar2;
              break;
            }
            lVar6 = lVar6 + 1;
            uVar3 = (int)((ulong)((long)(((local_68->m_data).structPtr)->m_members).
                                        super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(((local_68->m_data).structPtr)->m_members).
                                       super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x49249249;
            lVar5 = lVar5 + 0x38;
            bVar1 = lVar6 < (int)uVar3;
          } while (lVar6 < (int)uVar3);
        }
        return (bool)(bVar1 & (byte)uVar3);
      }
    }
    else if (((local_80.m_token == TOKEN_LEFT_BRACKET && type->m_type == TYPE_ARRAY) &&
             (glu::VarTokenizer::advance(&local_80), local_80.m_token == TOKEN_NUMBER)) &&
            (glu::VarTokenizer::advance(&local_80), local_80.m_token == TOKEN_RIGHT_BRACKET)) {
      bVar1 = traverseVariablePath
                        (typePath,subPath + (local_80.m_tokenLen + local_80.m_tokenStart),
                         (type->m_data).array.elementType);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool traverseVariablePath (std::vector<VariablePathComponent>& typePath, const char* subPath, const glu::VarType& type)
{
	glu::VarTokenizer tokenizer(subPath);

	typePath.push_back(VariablePathComponent(&type));

	if (tokenizer.getToken() == glu::VarTokenizer::TOKEN_END)
		return true;

	if (type.isStructType() && tokenizer.getToken() == glu::VarTokenizer::TOKEN_PERIOD)
	{
		tokenizer.advance();

		// malformed path
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_IDENTIFIER)
			return false;

		for (int memberNdx = 0; memberNdx < type.getStructPtr()->getNumMembers(); ++memberNdx)
			if (type.getStructPtr()->getMember(memberNdx).getName() == tokenizer.getIdentifier())
				return traverseVariablePath(typePath, subPath + tokenizer.getCurrentTokenEndLocation(), type.getStructPtr()->getMember(memberNdx).getType());

		// malformed path, no such member
		return false;
	}
	else if (type.isArrayType() && tokenizer.getToken() == glu::VarTokenizer::TOKEN_LEFT_BRACKET)
	{
		tokenizer.advance();

		// malformed path
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_NUMBER)
			return false;

		tokenizer.advance();
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_RIGHT_BRACKET)
			return false;

		return traverseVariablePath(typePath, subPath + tokenizer.getCurrentTokenEndLocation(), type.getElementType());
	}

	return false;
}